

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

int Prs_NtkAddConcat(Prs_Ntk_t *p,Vec_Int_t *vTemp)

{
  uint uVar1;
  int Entry;
  int Value;
  Vec_Int_t *vTemp_local;
  Prs_Ntk_t *p_local;
  
  uVar1 = Vec_IntSize(&p->vConcats);
  if ((uVar1 & 1) == 0) {
    Vec_IntPush(&p->vConcats,-1);
  }
  uVar1 = Vec_IntSize(&p->vConcats);
  if ((uVar1 & 1) != 0) {
    Entry = Vec_IntSize(vTemp);
    Vec_IntPush(&p->vConcats,Entry);
    Vec_IntAppend(&p->vConcats,vTemp);
    return uVar1;
  }
  __assert_fail("Value & 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0x105,"int Prs_NtkAddConcat(Prs_Ntk_t *, Vec_Int_t *)");
}

Assistant:

static inline int Prs_NtkAddConcat( Prs_Ntk_t * p, Vec_Int_t * vTemp )
{
    int Value;
    if ( !(Vec_IntSize(&p->vConcats) & 1) )
        Vec_IntPush(&p->vConcats, -1);
    Value = Vec_IntSize(&p->vConcats);
    assert( Value & 1 );
    Vec_IntPush( &p->vConcats, Vec_IntSize(vTemp) );
    Vec_IntAppend( &p->vConcats, vTemp );
    return Value;
}